

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O2

HPDF_Font HPDF_Type0Font_New(HPDF_MMgr mmgr,HPDF_FontDef_conflict fontdef,HPDF_Encoder encoder,
                            HPDF_Xref xref)

{
  byte *pbVar1;
  ushort uVar2;
  short sVar3;
  void *pvVar4;
  HPDF_FontDef fontdef_00;
  undefined8 *puVar5;
  HPDF_Xref xref_00;
  HPDF_FontDef_conflict p_Var6;
  HPDF_UINT16 HVar7;
  HPDF_INT16 HVar8;
  HPDF_INT HVar9;
  HPDF_Dict dict;
  undefined4 *s;
  HPDF_STATUS HVar10;
  HPDF_STATUS HVar11;
  HPDF_STATUS HVar12;
  HPDF_Array array;
  HPDF_Dict p_Var13;
  HPDF_STATUS HVar14;
  HPDF_Array p_Var15;
  ushort *puVar16;
  HPDF_Array p_Var17;
  long lVar18;
  HPDF_Dict p_Var19;
  HPDF_STATUS HVar20;
  HPDF_STATUS HVar21;
  HPDF_STATUS HVar22;
  HPDF_String p_Var23;
  HPDF_Error error;
  long lVar24;
  undefined1 *puVar25;
  undefined4 uVar26;
  char *pcVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  uint uStack_20078;
  ushort uStack_20062;
  HPDF_Xref p_Stack_20060;
  undefined8 *puStack_20058;
  HPDF_FontDef_conflict p_Stack_20050;
  void *pvStack_20048;
  char *pcStack_20040;
  HPDF_UNICODE tmp_map [65536];
  
  dict = HPDF_Dict_New(mmgr);
  if (dict == (HPDF_Dict)0x0) {
    return (HPDF_Font)0x0;
  }
  pbVar1 = (byte *)((long)&(dict->header).obj_class + 1);
  *pbVar1 = *pbVar1 | 1;
  if (encoder->type != HPDF_ENCODER_TYPE_DOUBLE_BYTE) {
    error = dict->error;
    HVar10 = 0x1028;
LAB_0011ddd7:
    HPDF_SetError(error,HVar10,0);
    return (HPDF_Font)0x0;
  }
  if (1 < fontdef->type - HPDF_FONTDEF_TYPE_TRUETYPE) {
    error = dict->error;
    HVar10 = 0x102e;
    goto LAB_0011ddd7;
  }
  s = (undefined4 *)HPDF_GetMem(mmgr,0x58);
  if (s == (undefined4 *)0x0) {
    HPDF_Dict_Free(dict);
    return (HPDF_Font)0x0;
  }
  pbVar1 = (byte *)((long)&(dict->header).obj_class + 1);
  *pbVar1 = *pbVar1 | 1;
  dict->write_fn = (HPDF_Dict_OnWriteFunc)0x0;
  dict->free_fn = OnFree_Func;
  dict->attr = s;
  pvVar4 = encoder->attr;
  p_Stack_20060 = xref;
  HPDF_MemSet(s,'\0',0x58);
  s[1] = *(undefined4 *)((long)pvVar4 + 0x40118);
  *(code **)(s + 2) = TextWidth;
  *(code **)(s + 4) = MeasureText;
  *(HPDF_FontDef_conflict *)(s + 6) = fontdef;
  *(HPDF_Encoder *)(s + 8) = encoder;
  *(HPDF_Xref *)(s + 0xe) = p_Stack_20060;
  p_Stack_20050 = fontdef;
  HVar10 = HPDF_Xref_Add(p_Stack_20060,dict);
  if (HVar10 != 0) {
    return (HPDF_Font)0x0;
  }
  HVar10 = HPDF_Dict_AddName(dict,"Type","Font");
  p_Var6 = p_Stack_20050;
  HVar11 = HPDF_Dict_AddName(dict,"BaseFont",p_Stack_20050->base_font);
  HVar12 = HPDF_Dict_AddName(dict,"Subtype","Type0");
  lVar24 = HVar12 + HVar11 + HVar10;
  if (p_Var6->type == HPDF_FONTDEF_TYPE_CID) {
    HVar10 = HPDF_Dict_AddName(dict,"Encoding",encoder->name);
LAB_0011de3f:
    lVar24 = HVar10 + lVar24;
  }
  else {
    HVar9 = HPDF_StrCmp((char *)((long)pvVar4 + 0x4019c),"Identity-H");
    xref_00 = p_Stack_20060;
    if (HVar9 != 0) {
      p_Var13 = CreateCMap(encoder,p_Stack_20060);
      *(HPDF_Dict *)(s + 0x14) = p_Var13;
      if (p_Var13 == (HPDF_Dict)0x0) {
        return (HPDF_Font)0x0;
      }
      HVar10 = HPDF_Dict_Add(dict,"Encoding",p_Var13);
      goto LAB_0011de3f;
    }
    HVar10 = HPDF_Dict_AddName(dict,"Encoding","Identity-H");
    p_Var13 = CreateCMap(encoder,xref_00);
    *(HPDF_Dict *)(s + 0x14) = p_Var13;
    if (p_Var13 == (HPDF_Dict)0x0) {
      return (HPDF_Font)0x0;
    }
    HVar11 = HPDF_Dict_Add(dict,"ToUnicode",p_Var13);
    lVar24 = HVar11 + HVar10 + lVar24;
  }
  if (lVar24 != 0) {
    return (HPDF_Font)0x0;
  }
  array = HPDF_Array_New(mmgr);
  if (array == (HPDF_Array)0x0) {
    return (HPDF_Font)0x0;
  }
  HVar10 = HPDF_Dict_Add(dict,"DescendantFonts",array);
  if (HVar10 != 0) {
    return (HPDF_Font)0x0;
  }
  pvVar4 = dict->attr;
  fontdef_00 = *(HPDF_FontDef *)((long)pvVar4 + 0x18);
  lVar24 = *(long *)((long)pvVar4 + 0x20);
  puVar5 = (undefined8 *)fontdef_00->attr;
  p_Stack_20050 = *(HPDF_FontDef_conflict *)(lVar24 + 0xd0);
  if (p_Var6->type == HPDF_FONTDEF_TYPE_CID) {
    p_Var13 = HPDF_Dict_New(dict->mmgr);
    uVar26 = 3;
    if ((p_Var13 != (HPDF_Dict)0x0) && (HVar10 = HPDF_Xref_Add(p_Stack_20060,p_Var13), HVar10 == 0))
    {
      HVar10 = HPDF_Dict_AddName(p_Var13,"Type","Font");
      HVar11 = HPDF_Dict_AddName(p_Var13,"Subtype","CIDFontType0");
      HVar12 = HPDF_Dict_AddNumber(p_Var13,"DW",(int)*(short *)(puVar5 + 1));
      pcStack_20040 = fontdef_00->base_font;
      HVar14 = HPDF_Dict_AddName(p_Var13,"BaseFont",pcStack_20040);
      if ((HVar14 + HVar12 + HVar11 + HVar10 == 0) &&
         ((p_Var15 = HPDF_Array_New(dict->mmgr), p_Var15 != (HPDF_Array)0x0 &&
          (HVar10 = HPDF_Dict_Add(p_Var13,"DW2",p_Var15), HVar10 == 0)))) {
        HVar10 = HPDF_Array_AddNumber(p_Var15,(int)*(short *)((long)puVar5 + 10));
        HVar11 = HPDF_Array_AddNumber(p_Var15,(int)*(short *)((long)puVar5 + 0xc));
        if ((HVar11 + HVar10 == 0) &&
           ((p_Var15 = HPDF_Array_New(dict->mmgr), p_Var15 != (HPDF_Array)0x0 &&
            (HVar10 = HPDF_Dict_Add(p_Var13,"W",p_Var15), HVar10 == 0)))) {
          p_Var17 = (HPDF_Array)0x0;
          puStack_20058 = (undefined8 *)((ulong)puStack_20058 & 0xffffffff00000000);
          uVar28 = 0;
          while( true ) {
            if (((HPDF_List)*puVar5)->count <= (uint)puStack_20058) break;
            puVar16 = (ushort *)HPDF_List_ItemAt((HPDF_List)*puVar5,(uint)puStack_20058);
            if ((p_Var17 == (HPDF_Array)0x0) || (uVar28 + 1 != (uint)*puVar16)) {
              p_Var17 = HPDF_Array_New(dict->mmgr);
              if (p_Var17 == (HPDF_Array)0x0) goto LAB_0011e5cd;
              pvStack_20048 = (void *)HPDF_Array_AddNumber(p_Var15,(uint)*puVar16);
              HVar10 = HPDF_Array_Add(p_Var15,p_Var17);
              lVar24 = HVar10 + (long)pvStack_20048;
            }
            else {
              lVar24 = 0;
            }
            HVar10 = HPDF_Array_AddNumber(p_Var17,(int)(short)puVar16[1]);
            if (HVar10 + lVar24 != 0) goto LAB_0011e5cd;
            uVar28 = (uint)*puVar16;
            puStack_20058 = (undefined8 *)CONCAT44(puStack_20058._4_4_,(uint)puStack_20058 + 1);
          }
          p_Var19 = HPDF_Dict_New(dict->mmgr);
          if (((p_Var19 == (HPDF_Dict)0x0) ||
              (HVar10 = HPDF_Xref_Add(p_Stack_20060,p_Var19), HVar10 != 0)) ||
             (HVar10 = HPDF_Dict_Add(p_Var13,"FontDescriptor",p_Var19), HVar10 != 0))
          goto LAB_0011e5cd;
          HVar10 = HPDF_Dict_AddName(p_Var19,"Type","FontDescriptor");
          HVar11 = HPDF_Dict_AddName(p_Var19,"FontName",pcStack_20040);
          HVar12 = HPDF_Dict_AddNumber(p_Var19,"Ascent",(int)fontdef_00->ascent);
          HVar14 = HPDF_Dict_AddNumber(p_Var19,"Descent",(int)fontdef_00->descent);
          HVar20 = HPDF_Dict_AddNumber(p_Var19,"CapHeight",(uint)fontdef_00->cap_height);
          HVar21 = HPDF_Dict_AddNumber(p_Var19,"MissingWidth",(int)fontdef_00->missing_width);
          HVar22 = HPDF_Dict_AddNumber(p_Var19,"Flags",fontdef_00->flags);
          if ((HVar22 + HVar21 + HVar20 + HVar14 + HVar12 + HVar11 + HVar10 != 0) ||
             (p_Var15 = HPDF_Box_Array_New(dict->mmgr,fontdef_00->font_bbox),
             p_Var15 == (HPDF_Array)0x0)) goto LAB_0011e5cd;
          HVar10 = HPDF_Dict_Add(p_Var19,"FontBBox",p_Var15);
          HVar11 = HPDF_Dict_AddNumber(p_Var19,"ItalicAngle",(int)fontdef_00->italic_angle);
          HVar12 = HPDF_Dict_AddNumber(p_Var19,"StemV",(uint)fontdef_00->stemv);
          if ((HVar12 + HVar11 + HVar10 != 0) ||
             ((p_Var19 = HPDF_Dict_New(dict->mmgr), p_Var19 == (HPDF_Dict)0x0 ||
              (HVar10 = HPDF_Dict_Add(p_Var13,"CIDSystemInfo",p_Var19), p_Var6 = p_Stack_20050,
              HVar10 != 0)))) goto LAB_0011e5cd;
          p_Var23 = HPDF_String_New(dict->mmgr,(char *)((long)p_Stack_20050 + 0x4011c),
                                    (HPDF_Encoder_conflict)0x0);
          HVar10 = HPDF_Dict_Add(p_Var19,"Registry",p_Var23);
          p_Var23 = HPDF_String_New(dict->mmgr,(char *)((long)p_Var6 + 0x4019c),
                                    (HPDF_Encoder_conflict)0x0);
          HVar11 = HPDF_Dict_Add(p_Var19,"Ordering",p_Var23);
          HVar12 = HPDF_Dict_AddNumber(p_Var19,"Supplement",*(HPDF_INT32 *)((long)p_Var6 + 0x4021c))
          ;
          if (HVar12 + HVar11 + HVar10 != 0) {
            p_Var13 = (HPDF_Dict)0x0;
          }
        }
        else {
LAB_0011e5cd:
          p_Var13 = (HPDF_Dict)0x0;
        }
        uVar26 = 3;
        goto LAB_0011e0c8;
      }
    }
    p_Var13 = (HPDF_Dict)0x0;
    goto LAB_0011e0c8;
  }
  p_Var13 = HPDF_Dict_New(dict->mmgr);
  if ((p_Var13 == (HPDF_Dict)0x0) || (HVar10 = HPDF_Xref_Add(p_Stack_20060,p_Var13), HVar10 != 0)) {
LAB_0011e0be:
    p_Var13 = (HPDF_Dict)0x0;
  }
  else {
    dict->before_write_fn = CIDFontType2_BeforeWrite_Func;
    puStack_20058 = puVar5;
    pvStack_20048 = pvVar4;
    HVar10 = HPDF_Dict_AddName(p_Var13,"Type","Font");
    HVar11 = HPDF_Dict_AddName(p_Var13,"Subtype","CIDFontType2");
    HVar12 = HPDF_Dict_AddNumber(p_Var13,"DW",(int)fontdef_00->missing_width);
    if ((HVar12 + HVar11 + HVar10 != 0) ||
       ((p_Var15 = HPDF_Array_New(p_Var13->mmgr), p_Var15 == (HPDF_Array)0x0 ||
        (HVar10 = HPDF_Dict_Add(p_Var13,"DW2",p_Var15), HVar10 != 0)))) goto LAB_0011e0be;
    HVar10 = HPDF_Array_AddNumber(p_Var15,(int)(fontdef_00->font_bbox).bottom);
    HVar11 = HPDF_Array_AddNumber
                       (p_Var15,(int)((fontdef_00->font_bbox).bottom - (fontdef_00->font_bbox).top))
    ;
    HPDF_MemSet(tmp_map,'\0',0x20000);
    if (HVar11 + HVar10 == 0) {
      pcVar27 = (char *)0x0;
      puVar25 = (undefined1 *)0x0;
      for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 1) {
        lVar30 = 0x100;
        pcStack_20040 = pcVar27;
        while (bVar31 = lVar30 != 0, lVar30 = lVar30 + -1, bVar31) {
          if (*(code **)(lVar24 + 0xa8) == HPDF_CMapEncoder_ToUnicode) {
            uVar2 = *(ushort *)((long)p_Stack_20050 + 0x20000 + (long)pcVar27 * 2);
            if ((ulong)uVar2 != 0) {
              HVar7 = HPDF_TTFontDef_GetGlyphid
                                (fontdef_00,
                                 *(HPDF_UINT16 *)((long)p_Stack_20050 + (long)pcVar27 * 2));
              tmp_map[uVar2] = HVar7;
              if ((ushort)puVar25 <= uVar2) {
                puVar25 = (undefined1 *)(ulong)uVar2;
              }
            }
          }
          else {
            HVar7 = HPDF_TTFontDef_GetGlyphid(fontdef_00,(HPDF_UINT16)pcVar27);
            tmp_map[(long)pcVar27] = HVar7;
            puVar25 = (undefined1 *)((ulong)puVar25 & 0xffff);
            if (puVar25 < pcVar27) {
              puVar25 = (undefined1 *)((ulong)pcVar27 & 0xffffffff);
            }
          }
          pcVar27 = pcVar27 + 1;
        }
        pcVar27 = pcStack_20040 + 0x100;
      }
      if ((short)puVar25 == 0) {
        HPDF_SetError(p_Var13->error,0x102d,0);
        goto LAB_0011e35f;
      }
      sVar3 = fontdef_00->missing_width;
      p_Var15 = HPDF_Array_New(p_Var13->mmgr);
      if ((p_Var15 == (HPDF_Array)0x0) || (HVar10 = HPDF_Dict_Add(p_Var13,"W",p_Var15), HVar10 != 0)
         ) goto LAB_0011e35f;
      uStack_20078 = (uint)puVar25 & 0xffff;
      p_Var17 = (HPDF_Array)0x0;
      for (lVar24 = 0; uStack_20078 != (uint)lVar24; lVar24 = lVar24 + 1) {
        HVar8 = HPDF_TTFontDef_GetGidWidth(fontdef_00,tmp_map[lVar24]);
        if (HVar8 == sVar3) {
          p_Var17 = (HPDF_Array)0x0;
        }
        else if (((p_Var17 == (HPDF_Array)0x0) &&
                 (((HVar10 = HPDF_Array_AddNumber(p_Var15,(uint)lVar24), HVar10 != 0 ||
                   (p_Var17 = HPDF_Array_New(p_Var13->mmgr), p_Var17 == (HPDF_Array)0x0)) ||
                  (HVar10 = HPDF_Array_Add(p_Var15,p_Var17), HVar10 != 0)))) ||
                (HVar10 = HPDF_Array_AddNumber(p_Var17,(int)HVar8), HVar10 != 0)) goto LAB_0011e35f;
      }
      if (*(int *)((long)puStack_20058 + 0x19c) != 0) {
        p_Var19 = HPDF_DictStream_New(p_Var13->mmgr,p_Stack_20060);
        *(HPDF_Dict *)((long)pvStack_20048 + 0x48) = p_Var19;
        if ((p_Var19 != (HPDF_Dict)0x0) &&
           (HVar10 = HPDF_Dict_Add(p_Var13,"CIDToGIDMap",p_Var19), HVar10 == 0)) {
          for (uVar29 = 0; uStack_20078 * 2 != uVar29; uVar29 = uVar29 + 2) {
            uVar2 = *(ushort *)((long)tmp_map + uVar29);
            uStack_20062 = uVar2 << 8 | uVar2 >> 8;
            HPDF_MemCpy((HPDF_BYTE *)((long)tmp_map + uVar29),(HPDF_BYTE *)&uStack_20062,2);
          }
          HVar10 = HPDF_Stream_Write(*(HPDF_Stream *)(*(long *)((long)pvStack_20048 + 0x48) + 0x40),
                                     (HPDF_BYTE *)tmp_map,uStack_20078 * 2);
          if (HVar10 == 0) goto LAB_0011e69d;
        }
        goto LAB_0011e35f;
      }
LAB_0011e69d:
      p_Var19 = HPDF_Dict_New(dict->mmgr);
      if ((p_Var19 == (HPDF_Dict)0x0) ||
         (HVar10 = HPDF_Dict_Add(p_Var13,"CIDSystemInfo",p_Var19), p_Var6 = p_Stack_20050,
         HVar10 != 0)) goto LAB_0011e35f;
      p_Var23 = HPDF_String_New(dict->mmgr,(char *)((long)p_Stack_20050 + 0x4011c),
                                (HPDF_Encoder_conflict)0x0);
      HVar10 = HPDF_Dict_Add(p_Var19,"Registry",p_Var23);
      p_Var23 = HPDF_String_New(dict->mmgr,(char *)((long)p_Var6 + 0x4019c),
                                (HPDF_Encoder_conflict)0x0);
      HVar11 = HPDF_Dict_Add(p_Var19,"Ordering",p_Var23);
      HVar12 = HPDF_Dict_AddNumber(p_Var19,"Supplement",*(HPDF_INT32 *)((long)p_Var6 + 0x4021c));
      if (HVar12 + HVar11 + HVar10 != 0) {
        p_Var13 = (HPDF_Dict)0x0;
      }
    }
    else {
LAB_0011e35f:
      p_Var13 = (HPDF_Dict)0x0;
    }
  }
  uVar26 = 4;
LAB_0011e0c8:
  *(HPDF_Dict *)(s + 0x10) = p_Var13;
  *s = uVar26;
  if (p_Var13 == (HPDF_Dict)0x0) {
    return (HPDF_Font)0x0;
  }
  HVar10 = HPDF_Array_Add(array,p_Var13);
  if (HVar10 == 0) {
    return dict;
  }
  return (HPDF_Font)0x0;
}

Assistant:

HPDF_Font
HPDF_Type0Font_New  (HPDF_MMgr        mmgr,
                     HPDF_FontDef     fontdef,
                     HPDF_Encoder     encoder,
                     HPDF_Xref        xref)
{
    HPDF_Dict font;
    HPDF_FontAttr attr;
    HPDF_CMapEncoderAttr encoder_attr;
    HPDF_STATUS ret = 0;
    HPDF_Array descendant_fonts;

    HPDF_PTRACE ((" HPDF_Type0Font_New\n"));

    font = HPDF_Dict_New (mmgr);
    if (!font)
        return NULL;

    font->header.obj_class |= HPDF_OSUBCLASS_FONT;

    /* check whether the fontdef object and the encoder object is valid. */
    if (encoder->type != HPDF_ENCODER_TYPE_DOUBLE_BYTE) {
        HPDF_SetError(font->error, HPDF_INVALID_ENCODER_TYPE, 0);
        return NULL;
    }

    if (fontdef->type != HPDF_FONTDEF_TYPE_CID &&
        fontdef->type != HPDF_FONTDEF_TYPE_TRUETYPE) {
        HPDF_SetError(font->error, HPDF_INVALID_FONTDEF_TYPE, 0);
        return NULL;
    }

    attr = HPDF_GetMem (mmgr, sizeof(HPDF_FontAttr_Rec));
    if (!attr) {
        HPDF_Dict_Free (font);
        return NULL;
    }

    font->header.obj_class |= HPDF_OSUBCLASS_FONT;
    font->write_fn = NULL;
    font->free_fn = OnFree_Func;
    font->attr = attr;

    encoder_attr = (HPDF_CMapEncoderAttr)encoder->attr;

    HPDF_MemSet (attr, 0, sizeof(HPDF_FontAttr_Rec));

    attr->writing_mode = encoder_attr->writing_mode;
    attr->text_width_fn = TextWidth;
    attr->measure_text_fn = MeasureText;
    attr->fontdef = fontdef;
    attr->encoder = encoder;
    attr->xref = xref;

    if (HPDF_Xref_Add (xref, font) != HPDF_OK)
        return NULL;

    ret += HPDF_Dict_AddName (font, "Type", "Font");
    ret += HPDF_Dict_AddName (font, "BaseFont", fontdef->base_font);
    ret += HPDF_Dict_AddName (font, "Subtype", "Type0");

    if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        ret += HPDF_Dict_AddName (font, "Encoding", encoder->name);
    } else {
        /*
	 * Handle the Unicode encoding, see hpdf_encoding_utf.c For some
	 * reason, xpdf-based readers cannot deal with our cmap but work
	 * fine when using the predefined "Identity-H"
	 * encoding. However, text selection does not work, unless we
	 * add a ToUnicode cmap. This CMap should also be "Identity",
	 * but that does not work -- specifying our cmap as a stream however
	 * does work. Who can understand that ?
	 */
        if (HPDF_StrCmp(encoder_attr->ordering, "Identity-H") == 0) {
	    ret += HPDF_Dict_AddName (font, "Encoding", "Identity-H");
	    attr->cmap_stream = CreateCMap (encoder, xref);

	    if (attr->cmap_stream) {
	        ret += HPDF_Dict_Add (font, "ToUnicode", attr->cmap_stream);
	    } else
	        return NULL;
	} else {
            attr->cmap_stream = CreateCMap (encoder, xref);

	    if (attr->cmap_stream) {
	        ret += HPDF_Dict_Add (font, "Encoding", attr->cmap_stream);
	    } else
	      return NULL;
	}
    }

    if (ret != HPDF_OK)
        return NULL;

    descendant_fonts = HPDF_Array_New (mmgr);
    if (!descendant_fonts)
        return NULL;

    if (HPDF_Dict_Add (font, "DescendantFonts", descendant_fonts) != HPDF_OK)
        return NULL;

    if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        attr->descendant_font = CIDFontType0_New (font, xref);
        attr->type = HPDF_FONT_TYPE0_CID;
    } else {
        attr->descendant_font = CIDFontType2_New (font, xref);
        attr->type = HPDF_FONT_TYPE0_TT;
    }

    if (!attr->descendant_font)
        return NULL;
    else
        if (HPDF_Array_Add (descendant_fonts, attr->descendant_font) !=
                HPDF_OK)
            return NULL;

    return font;
}